

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptNativeFloatArray::JavascriptNativeFloatArray
          (JavascriptNativeFloatArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  ulong uVar2;
  
  JavascriptNativeArray::JavascriptNativeArray(&this->super_JavascriptNativeArray,type);
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01394300;
  pSVar1 = &JavascriptArray::
            DetermineInlineHeadSegmentPointer<Js::JavascriptNativeFloatArray,0u,false>(this)->
            super_SparseArraySegmentBase;
  JavascriptArray::SetHeadAndLastUsedSegment((JavascriptArray *)this,pSVar1);
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  pSVar1->size = size;
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
    *(undefined1 **)(&pSVar1[1].left + uVar2 * 2) = &DAT_fff80002fff80002;
  }
  return;
}

Assistant:

JavascriptNativeFloatArray::JavascriptNativeFloatArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeFloatArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<double>::From(head)->FillSegmentBuffer(0, size);
    }